

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O2

void anon_unknown.dwarf_388b1::not_equals(void)

{
  int local_44 [5];
  Assert local_30 [2];
  
  local_30[0].m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_30[0].m_line = 0x66;
  local_44[1] = 1;
  local_44[0] = 2;
  UnitTests::Assert::NotEquals<int,int>(local_30,local_44 + 1,local_44);
  return;
}

Assistant:

TEST(assert_true1)
    {
        try
        {
            ASSERT_TRUE(1 == 2);
            FAIL("ASSERT_TRUE should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg      = e.what();
            std::string expected = "error A1000: Assertion failure :  Expression evaluated to false";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_TRUE", __FILE__, __LINE__);
            }
        }
    }